

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2_p.h
# Opt level: O0

void __thiscall QGles2CommandBuffer::resetState(QGles2CommandBuffer *this)

{
  QGles2CommandBuffer *in_RDI;
  
  in_RDI->recordingPass = NoPass;
  in_RDI->passNeedsResourceTracking = true;
  in_RDI->currentTarget = (QRhiRenderTarget *)0x0;
  resetCommands(in_RDI);
  resetCachedState(in_RDI);
  return;
}

Assistant:

void resetState() {
        recordingPass = NoPass;
        passNeedsResourceTracking = true;
        // do not zero lastGpuTime
        currentTarget = nullptr;
        resetCommands();
        resetCachedState();
    }